

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O2

bool __thiscall ON_ObjRef_IRefID::Read(ON_ObjRef_IRefID *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int minor_version;
  int major_version;
  int local_20;
  int local_1c;
  
  Default(this);
  local_1c = 0;
  local_20 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&local_1c,&local_20);
  if (!bVar1) {
    return false;
  }
  if ((((local_1c == 1) && (bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_iref_uuid), bVar1))
      && (bVar1 = ON_BinaryArchive::ReadXform(archive,&this->m_iref_xform), bVar1)) &&
     (bVar1 = ON_BinaryArchive::ReadUuid(archive,&this->m_idef_uuid), bVar1)) {
    bVar1 = ON_BinaryArchive::ReadInt(archive,&this->m_idef_geometry_index);
    if ((!bVar1) || (local_20 < 1)) goto LAB_0056c678;
    bVar1 = ON_BinaryArchive::ReadComponentIndex(archive,&this->m_component_index);
    if (bVar1) {
      bVar1 = ON_ObjRefEvaluationParameter::Read(&this->m_evp,archive);
      goto LAB_0056c678;
    }
  }
  bVar1 = false;
LAB_0056c678:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_ObjRef_IRefID::Read( ON_BinaryArchive& archive )
{
  Default();

  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( 
                          TCODE_ANONYMOUS_CHUNK, 
                          &major_version, 
                          &minor_version );
  if ( !rc )
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = archive.ReadUuid(m_iref_uuid);
    if (!rc) break;

    rc = archive.ReadXform(m_iref_xform);
    if (!rc) break;

    rc = archive.ReadUuid(m_idef_uuid);
    if (!rc) break;

    rc = archive.ReadInt(&m_idef_geometry_index);
    if (!rc) break;

    if ( minor_version >= 1 )
    {
      // 13 July 2006 - 1.1 - added m_component_index and m_evp
      rc = archive.ReadComponentIndex(m_component_index);
      if (!rc) break;

      rc = m_evp.Read(archive);
      if (!rc) break;
    }

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}